

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O2

Roaring * __thiscall doublechecked::Roaring::operator-=(Roaring *this,Roaring *r)

{
  _Base_ptr p_Var1;
  uint value;
  _Rb_tree_color local_2c;
  
  roaring::Roaring::operator-=(&this->plain,&r->plain);
  for (p_Var1 = (r->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(r->check)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    local_2c = p_Var1[1]._M_color;
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::erase(&(this->check)._M_t,&local_2c);
  }
  return this;
}

Assistant:

Roaring &operator-=(const Roaring &r) {
        plain -= r.plain;

        for (auto value : r.check)
            check.erase(value);  // Note std::remove() is not for ordered sets

        return *this;
    }